

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O0

ChVector<double> * __thiscall
chrono::viper::Viper::GetWheelAppliedTorque
          (ChVector<double> *__return_storage_ptr__,Viper *this,ViperWheelID id)

{
  __shared_ptr_access<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  undefined1 local_30 [28];
  ViperWheelID id_local;
  Viper *this_local;
  
  local_30._20_4_ = id;
  unique0x10000092 = this;
  this_local = (Viper *)__return_storage_ptr__;
  this_00 = (__shared_ptr_access<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::array<std::shared_ptr<chrono::viper::ViperWheel>,_4UL>::operator[]
                         (&this->m_wheels,(ulong)id);
  std::__shared_ptr_access<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(this_00);
  ViperPart::GetBody((ViperPart *)local_30);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  chrono::ChBody::GetAppliedTorque();
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> Viper::GetWheelAppliedTorque(ViperWheelID id) const {
    return m_wheels[id]->GetBody()->GetAppliedTorque();
}